

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

char_int_type __thiscall
nlohmann::detail::
lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<const_char_*>_>
::get(lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<const_char_*>_>
      *this)

{
  size_t *psVar1;
  byte *pbVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  uint uVar5;
  int iVar6;
  undefined1 in_ZMM1 [64];
  char local_9;
  
  auVar4._0_8_ = (this->position).chars_read_total;
  auVar4._8_8_ = (this->position).chars_read_current_line;
  auVar3 = vpcmpeqd_avx(in_ZMM1._0_16_,in_ZMM1._0_16_);
  auVar4 = vpsubq_avx(auVar4,auVar3);
  (this->position).chars_read_total = auVar4._0_8_;
  (this->position).chars_read_current_line = auVar4._8_8_;
  if (this->next_unget == true) {
    this->next_unget = false;
    uVar5 = this->current;
  }
  else {
    pbVar2 = (byte *)(this->ia).current;
    if (pbVar2 == (byte *)(this->ia).end) {
      uVar5 = 0xffffffff;
    }
    else {
      uVar5 = (uint)*pbVar2;
      (this->ia).current = (char *)(pbVar2 + 1);
    }
    this->current = uVar5;
  }
  if (uVar5 == 0xffffffff) {
    iVar6 = -1;
  }
  else {
    local_9 = (char)uVar5;
    std::vector<char,_std::allocator<char>_>::emplace_back<char>(&this->token_string,&local_9);
    iVar6 = this->current;
    if (iVar6 == 10) {
      psVar1 = &(this->position).lines_read;
      *psVar1 = *psVar1 + 1;
      (this->position).chars_read_current_line = 0;
      iVar6 = 10;
    }
  }
  return iVar6;
}

Assistant:

char_int_type get()
    {
        ++position.chars_read_total;
        ++position.chars_read_current_line;

        if (next_unget)
        {
            // just reset the next_unget variable and work with current
            next_unget = false;
        }
        else
        {
            current = ia.get_character();
        }

        if (JSON_HEDLEY_LIKELY(current != std::char_traits<char_type>::eof()))
        {
            token_string.push_back(std::char_traits<char_type>::to_char_type(current));
        }

        if (current == '\n')
        {
            ++position.lines_read;
            position.chars_read_current_line = 0;
        }

        return current;
    }